

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O3

PropertyIdArray * Js::ByteCodeReader::ReadPropertyIdArray(uint offset,FunctionBody *functionBody)

{
  byte bVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  ByteBlock *pBVar6;
  byte *pbVar7;
  undefined4 *puVar8;
  ulong uVar9;
  
  pBVar6 = (ByteBlock *)FunctionProxy::GetAuxPtr((FunctionProxy *)functionBody,AuxBlock);
  pbVar7 = ByteBlock::GetBuffer(pBVar6);
  uVar9 = (ulong)offset;
  bVar1 = pbVar7[uVar9 + 4];
  iVar2 = *(int *)(pbVar7 + uVar9);
  pBVar6 = (ByteBlock *)FunctionProxy::GetAuxPtr((FunctionProxy *)functionBody,AuxBlock);
  uVar5 = ByteBlock::GetLength(pBVar6);
  if ((ulong)uVar5 < uVar9 + (ulong)((uint)bVar1 + iVar2) * 4 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0x10b,
                                "(offset + propIds->GetDataSize() <= functionBody->GetAuxiliaryData()->GetLength())"
                                ,
                                "offset + propIds->GetDataSize() <= functionBody->GetAuxiliaryData()->GetLength()"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  return (PropertyIdArray *)(pbVar7 + uVar9);
}

Assistant:

const Js::PropertyIdArray * ByteCodeReader::ReadPropertyIdArray(uint offset, FunctionBody * functionBody)
    {
        Js::PropertyIdArray const * propIds = (Js::PropertyIdArray const *)(functionBody->GetAuxiliaryData()->GetBuffer() + offset);
        Assert(offset + propIds->GetDataSize() <= functionBody->GetAuxiliaryData()->GetLength());
        return propIds;
    }